

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_scalar_three_reg_same_fp16(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  uintptr_t o_30;
  TCGTemp *pTVar1;
  TCGv_i64 ret;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_10;
  uintptr_t o_2;
  uint uVar4;
  uintptr_t o_29;
  TCGv_i32 ret_00;
  code *func;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_i64 local_38;
  
  uVar4 = insn >> 0x19 & 0x10 | insn >> 0x14 & 8 | insn >> 0xb & 7;
  if ((0x1d < uVar4) || ((0x34308098U >> uVar4 & 1) == 0)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  s_00 = s->uc->tcg_ctx;
  if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) {
    unallocated_encoding_aarch64(s);
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)s_00);
  tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,0x2ed0);
  pTVar2 = read_fp_hreg((DisasContext_conflict1 *)s->uc->tcg_ctx,insn >> 5 & 0x1f);
  pTVar3 = read_fp_hreg((DisasContext_conflict1 *)s->uc->tcg_ctx,insn >> 0x10 & 0x1f);
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar1 - (long)s_00);
  if (uVar4 < 0xf) {
    if (uVar4 == 3) {
      func = helper_advsimd_mulxh_aarch64;
    }
    else if (uVar4 == 4) {
      func = helper_advsimd_ceq_f16_aarch64;
    }
    else {
      if (uVar4 != 7) goto switchD_006b0f5d_caseD_10;
      func = helper_recpsf_f16_aarch64;
    }
  }
  else {
    switch(uVar4) {
    case 0xf:
      func = helper_rsqrtsf_f16_aarch64;
      break;
    default:
switchD_006b0f5d_caseD_10:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x256c,(char *)0x0);
    case 0x14:
      func = helper_advsimd_cge_f16_aarch64;
      break;
    case 0x15:
      func = helper_advsimd_acge_f16_aarch64;
      break;
    case 0x1a:
      local_48 = (TCGTemp *)(pTVar2 + (long)&s_00->pool_cur);
      local_40 = pTVar3 + (long)&s_00->pool_cur;
      local_38 = (TCGv_i64)((long)s_00 + (long)ret);
      tcg_gen_callN_aarch64
                (s_00,helper_advsimd_subh_aarch64,(TCGTemp *)((long)s_00 + (long)ret_00),3,&local_48
                );
      tcg_gen_andi_i32_aarch64(s_00,ret_00,ret_00,0x7fff);
      goto LAB_006b117d;
    case 0x1c:
      func = helper_advsimd_cgt_f16_aarch64;
      break;
    case 0x1d:
      func = helper_advsimd_acgt_f16_aarch64;
    }
  }
  local_38 = (TCGv_i64)((long)s_00 + (long)ret);
  local_40 = pTVar3 + (long)&s_00->pool_cur;
  local_48 = (TCGTemp *)(pTVar2 + (long)&s_00->pool_cur);
  tcg_gen_callN_aarch64(s_00,func,(TCGTemp *)((long)s_00 + (long)ret_00),3,&local_48);
LAB_006b117d:
  write_fp_sreg(s,insn & 0x1f,ret_00);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

static void disas_simd_scalar_three_reg_same_fp16(DisasContext *s,
                                                  uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 3);
    int rm = extract32(insn, 16, 5);
    bool u = extract32(insn, 29, 1);
    bool a = extract32(insn, 23, 1);
    int fpopcode = opcode | (a << 3) |  (u << 4);
    TCGv_ptr fpst;
    TCGv_i32 tcg_op1;
    TCGv_i32 tcg_op2;
    TCGv_i32 tcg_res;

    switch (fpopcode) {
    case 0x03: /* FMULX */
    case 0x04: /* FCMEQ (reg) */
    case 0x07: /* FRECPS */
    case 0x0f: /* FRSQRTS */
    case 0x14: /* FCMGE (reg) */
    case 0x15: /* FACGE */
    case 0x1a: /* FABD */
    case 0x1c: /* FCMGT (reg) */
    case 0x1d: /* FACGT */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
    }

    if (!fp_access_check(s)) {
        return;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, true);

    tcg_op1 = read_fp_hreg(s, rn);
    tcg_op2 = read_fp_hreg(s, rm);
    tcg_res = tcg_temp_new_i32(tcg_ctx);

    switch (fpopcode) {
    case 0x03: /* FMULX */
        gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x04: /* FCMEQ (reg) */
        gen_helper_advsimd_ceq_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x07: /* FRECPS */
        gen_helper_recpsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x0f: /* FRSQRTS */
        gen_helper_rsqrtsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x14: /* FCMGE (reg) */
        gen_helper_advsimd_cge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x15: /* FACGE */
        gen_helper_advsimd_acge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x1a: /* FABD */
        gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        tcg_gen_andi_i32(tcg_ctx, tcg_res, tcg_res, 0x7fff);
        break;
    case 0x1c: /* FCMGT (reg) */
        gen_helper_advsimd_cgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x1d: /* FACGT */
        gen_helper_advsimd_acgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    default:
        g_assert_not_reached();
    }

    write_fp_sreg(s, rd, tcg_res);


    tcg_temp_free_i32(tcg_ctx, tcg_res);
    tcg_temp_free_i32(tcg_ctx, tcg_op1);
    tcg_temp_free_i32(tcg_ctx, tcg_op2);
    tcg_temp_free_ptr(tcg_ctx, fpst);
}